

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phong.hpp
# Opt level: O3

void __thiscall Phong::Phong(Phong *this,Json *conf)

{
  value_t vVar1;
  bool bVar2;
  const_reference pvVar3;
  vec3f vVar4;
  const_iterator result;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_58;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_38;
  
  (this->super_BRDF)._vptr_BRDF = (_func_int **)0x16a798;
  *(undefined8 *)&this->field_0x28 = 0x16a7c8;
  *(undefined8 *)&(this->super_BRDF).field_0x8 = 0;
  *(undefined8 *)&(this->super_BRDF).field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  this->exp = 0.0;
  *(undefined4 *)&this->field_0x30 = 2;
  local_38.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_38.m_it.array_iterator._M_current = (pointer)0x0;
  local_38.m_it.primitive_iterator.m_it = -0x8000000000000000;
  vVar1 = conf->m_type;
  local_38.m_object = conf;
  if (vVar1 == object) {
    local_38.m_it.object_iterator._M_node =
         (_Base_ptr)
         std::
         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
         ::_M_find_tr<char[3],void>
                   ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                     *)(conf->m_value).object,(char (*) [3])"Ka");
    vVar1 = conf->m_type;
LAB_0013aa10:
    local_58.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_58.m_it.array_iterator._M_current = (pointer)0x0;
    local_58.m_it.primitive_iterator.m_it = -0x8000000000000000;
    if (vVar1 == array) goto LAB_0013aa3c;
    if (vVar1 == object) {
      local_58.m_it.object_iterator._M_node =
           &(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      local_58.m_it.primitive_iterator.m_it = 1;
    }
  }
  else {
    if (vVar1 != array) {
      local_38.m_it.primitive_iterator.m_it = 1;
      goto LAB_0013aa10;
    }
    local_38.m_it.array_iterator._M_current =
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
LAB_0013aa3c:
    local_58.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_58.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_58.m_it.array_iterator._M_current =
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  local_58.m_object = conf;
  bVar2 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==(&local_38,&local_58);
  if (!bVar2) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"Ka");
    vVar4 = json2vec3f(pvVar3);
    *(long *)&(this->super_BRDF).field_0x8 = vVar4._0_8_;
    *(float *)&(this->super_BRDF).field_0x10 = vVar4.z;
  }
  local_38.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_38.m_it.array_iterator._M_current = (pointer)0x0;
  local_38.m_it.primitive_iterator.m_it = -0x8000000000000000;
  vVar1 = conf->m_type;
  if (vVar1 == object) {
    local_38.m_object = conf;
    local_38.m_it.object_iterator._M_node =
         (_Base_ptr)
         std::
         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
         ::_M_find_tr<char[3],void>
                   ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                     *)(conf->m_value).object,(char (*) [3])"Ks");
    vVar1 = conf->m_type;
LAB_0013aae9:
    local_58.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_58.m_it.array_iterator._M_current = (pointer)0x0;
    local_58.m_it.primitive_iterator.m_it = -0x8000000000000000;
    if (vVar1 == array) goto LAB_0013ab15;
    if (vVar1 == object) {
      local_58.m_it.object_iterator._M_node =
           &(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      local_58.m_it.primitive_iterator.m_it = 1;
    }
  }
  else {
    if (vVar1 != array) {
      local_38.m_it.primitive_iterator.m_it = 1;
      local_38.m_object = conf;
      goto LAB_0013aae9;
    }
    local_38.m_it.array_iterator._M_current =
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_38.m_object = conf;
LAB_0013ab15:
    local_58.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_58.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_58.m_it.array_iterator._M_current =
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  local_58.m_object = conf;
  bVar2 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==(&local_38,&local_58);
  if (!bVar2) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"Ks");
    vVar4 = json2vec3f(pvVar3);
    *(long *)&(this->super_BRDF).field_0x14 = vVar4._0_8_;
    *(float *)&this->field_0x1c = vVar4.z;
  }
  local_38.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_38.m_it.array_iterator._M_current = (pointer)0x0;
  local_38.m_it.primitive_iterator.m_it = -0x8000000000000000;
  vVar1 = conf->m_type;
  if (vVar1 == object) {
    local_38.m_object = conf;
    local_38.m_it.object_iterator._M_node =
         (_Base_ptr)
         std::
         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
         ::_M_find_tr<char[4],void>
                   ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                     *)(conf->m_value).object,(char (*) [4])"exp");
    vVar1 = conf->m_type;
LAB_0013abc2:
    local_58.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_58.m_it.array_iterator._M_current = (pointer)0x0;
    local_58.m_it.primitive_iterator.m_it = -0x8000000000000000;
    if (vVar1 != array) {
      if (vVar1 == object) {
        local_58.m_it.object_iterator._M_node =
             &(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
      }
      else {
        local_58.m_it.primitive_iterator.m_it = 1;
      }
      goto LAB_0013ac06;
    }
  }
  else {
    if (vVar1 != array) {
      local_38.m_it.primitive_iterator.m_it = 1;
      local_38.m_object = conf;
      goto LAB_0013abc2;
    }
    local_38.m_it.array_iterator._M_current =
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_38.m_object = conf;
  }
  local_58.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_58.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_58.m_it.array_iterator._M_current =
       (((conf->m_value).array)->
       super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
LAB_0013ac06:
  local_58.m_object = conf;
  bVar2 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==(&local_38,&local_58);
  if (!bVar2) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"exp");
    nlohmann::detail::
    get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
              (pvVar3,(double *)&local_38);
    this->exp = (double)local_38.m_object;
  }
  return;
}

Assistant:

Phong(const Json& conf)
	{
		flags = REFLECT;
		if (conf.find("Ka") != conf.end()) Ka = json2vec3f(conf["Ka"]);
		if (conf.find("Ks") != conf.end()) Ks = json2vec3f(conf["Ks"]);
		if (conf.find("exp") != conf.end()) exp = conf["exp"];
	}